

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::parse_resource_id(bounded_buffer *data,uint32_t id,string *result)

{
  bool bVar1;
  string *in_RDX;
  char16_t *in_stack_00000018;
  uint32_t in_stack_00000024;
  bounded_buffer *in_stack_00000028;
  char16_t c;
  uint32_t i;
  UCharString rawString;
  uint32_t rawSize;
  uint16_t len;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
  *in_stack_ffffffffffffff80;
  char16_t in_stack_ffffffffffffff8e;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_4c;
  ushort local_22;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar2;
  
  bVar1 = readWord(in_stack_00000028,in_stack_00000024,(uint16_t *)in_stack_00000018);
  if (bVar1) {
    std::__cxx11::u16string::u16string
              ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    for (local_4c = 0; local_4c < (uint)local_22 << 1; local_4c = local_4c + 2) {
      bVar1 = readChar16(in_stack_00000028,in_stack_00000024,in_stack_00000018);
      if (!bVar1) {
        bVar2 = 0;
        goto LAB_0013a27a;
      }
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e);
    }
    from_utf16((UCharString *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    std::__cxx11::string::operator=(in_RDX,(string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    bVar2 = 1;
LAB_0013a27a:
    std::__cxx11::u16string::~u16string(in_stack_ffffffffffffff80);
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool parse_resource_id(bounded_buffer *data,
                       std::uint32_t id,
                       std::string &result) {
  std::uint16_t len;
  if (!readWord(data, id, len)) {
    return false;
  }
  id += 2;

  std::uint32_t rawSize = len * 2U;
  UCharString rawString;
  for (std::uint32_t i = 0; i < rawSize; i += 2) {
    char16_t c;
    if (!readChar16(data, id + i, c)) {
      return false;
    }
    rawString.push_back(c);
  }

  result = from_utf16(rawString);
  return true;
}